

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5calc.cpp
# Opt level: O0

void MD5_String2binary(char *string,uchar *output)

{
  uint uVar1;
  uint uVar2;
  uint *B2;
  uint *D2;
  size_t sVar3;
  uint local_ac;
  uint high;
  int i;
  uint *D;
  uint *C;
  uint *B;
  uint *A;
  uint msg_digest [4];
  uint copy_len;
  uint string_bit_len;
  uint string_byte_len;
  uchar *pstring;
  uchar padding_message [64];
  uchar *output_local;
  char *string_local;
  
  B2 = (uint *)((long)&A + 4);
  D2 = msg_digest + 1;
  A._0_4_ = 0x67452301;
  A._4_4_ = 0xefcdab89;
  msg_digest[0] = 0x98badcfe;
  msg_digest[1] = 0x10325476;
  padding_message._56_8_ = output;
  sVar3 = strlen(string);
  uVar1 = (uint)sVar3;
  _string_bit_len = (uchar *)string;
  for (local_ac = uVar1; 0x3f < (int)local_ac; local_ac = local_ac - 0x40) {
    MD5_Round_Calculate(_string_bit_len,(uint *)&A,B2,msg_digest,D2);
    _string_bit_len = _string_bit_len + 0x40;
  }
  uVar2 = uVar1 & 0x3f;
  strncpy((char *)&pstring,(char *)_string_bit_len,(ulong)uVar2);
  memset(padding_message + ((ulong)uVar2 - 8),0,(ulong)(0x40 - uVar2));
  padding_message[(ulong)uVar2 - 8] = padding_message[(ulong)uVar2 - 8] | 0x80;
  if (0x37 < uVar2) {
    MD5_Round_Calculate((uchar *)&pstring,(uint *)&A,B2,msg_digest,D2);
    memset(&pstring,0,0x38);
  }
  padding_message._48_4_ = uVar1 << 3;
  if (uVar1 < 0x20000000) {
    memset(padding_message + 0x34,0,4);
  }
  else {
    padding_message._52_4_ = (uVar1 + 0xe0000001) * 8;
  }
  MD5_Round_Calculate((uchar *)&pstring,(uint *)&A,B2,msg_digest,D2);
  *(uint **)padding_message._56_8_ = A;
  *(undefined8 *)(padding_message._56_8_ + 8) = msg_digest._0_8_;
  return;
}

Assistant:

static void MD5_String2binary(const char * string, unsigned char * output)
{
//var
   /*8bit*/
   unsigned char padding_message[64]; //Extended message   512bit 64byte
   unsigned char *pstring;            //The position of string in the present scanning notes is held.

   /*32bit*/
   unsigned int string_byte_len,     //The byte chief of string is held.
                string_bit_len,      //The bit length of string is held.
                copy_len,            //The number of bytes which is used by 1-3 and which remained
                msg_digest[4];       //Message digest   128bit 4byte
   unsigned int *A = &msg_digest[0], //The message digest in accordance with RFC (reference)
                *B = &msg_digest[1],
                *C = &msg_digest[2],
                *D = &msg_digest[3];
	int i;

//prog
   //Step 3.Initialize MD Buffer (although it is the initialization; step 3 of A, B, C, and D -- unavoidable -- a head)
   *A = 0x67452301;
   *B = 0xefcdab89;
   *C = 0x98badcfe;
   *D = 0x10325476;

   //Step 1.Append Padding Bits (extension of a mark bit)
   //1-1
   string_byte_len = (unsigned int)strlen(string);    //The byte chief of a character sequence is acquired.
   pstring = (unsigned char *)string; //The position of the present character sequence is set.

   //1-2  Repeat calculation until length becomes less than 64 bytes.
   for (i=string_byte_len; 64<=i; i-=64,pstring+=64)
        MD5_Round_Calculate(pstring, A,B,C,D);

   //1-3
   copy_len = string_byte_len % 64;                               //The number of bytes which remained is computed.
   strncpy((char *)padding_message, (char *)pstring, copy_len); //A message is copied to an extended bit sequence.
   memset(padding_message+copy_len, 0, 64 - copy_len);           //It buries by 0 until it becomes extended bit length.
   padding_message[copy_len] |= 0x80;                            //The next of a message is 1.

   //1-4
   //If 56 bytes or more (less than 64 bytes) of remainder becomes, it will calculate by extending to 64 bytes.
   if (56 <= copy_len) {
       MD5_Round_Calculate(padding_message, A,B,C,D);
       memset(padding_message, 0, 56); //56 bytes is newly fill uped with 0.
   }

   //Step 2.Append Length (the information on length is added)
   string_bit_len = string_byte_len * 8;             //From the byte chief to bit length (32 bytes of low rank)
   memcpy(&padding_message[56], &string_bit_len, 4); //32 bytes of low rank is set.

   //When bit length cannot be expressed in 32 bytes of low rank, it is a beam raising to a higher rank.
  if (UINT_MAX / 8 < string_byte_len) {
      unsigned int high = (string_byte_len - UINT_MAX / 8) * 8;
      memcpy(&padding_message[60], &high, 4);
  } else
      memset(&padding_message[60], 0, 4); //In this case, it is good for a higher rank at 0.

   //Step 4.Process Message in 16-Word Blocks (calculation of MD5)
   MD5_Round_Calculate(padding_message, A,B,C,D);

   //Step 5.Output (output)
   memcpy(output,msg_digest,16);
}